

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

void get_start_tok(AV1_COMP *cpi,int tile_row,int tile_col,int mi_row,TokenExtra **tok,
                  int sb_size_log2,int num_planes)

{
  long lVar1;
  uint uVar2;
  int *piVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long *in_R8;
  int in_R9D;
  int tile_mb_row;
  int tile_mb_cols;
  TileInfo *tile_info;
  TileDataEnc *this_tile;
  int tile_cols;
  AV1_COMMON *cm;
  
  piVar3 = (int *)(*(long *)(in_RDI + 0x71318) +
                  (long)(in_ESI * *(int *)(in_RDI + 0x42020) + in_EDX) * 0x5d10);
  lVar1 = *(long *)(in_RDI + 0x71330 + (long)in_ESI * 0x200 + (long)in_EDX * 8);
  uVar2 = get_token_alloc((in_ECX - *piVar3) + 2 >> 2,(piVar3[3] - piVar3[2]) + 2 >> 2,in_R9D,
                          tile_mb_row);
  *in_R8 = lVar1 + (ulong)uVar2;
  return;
}

Assistant:

static inline void get_start_tok(AV1_COMP *cpi, int tile_row, int tile_col,
                                 int mi_row, TokenExtra **tok, int sb_size_log2,
                                 int num_planes) {
  AV1_COMMON *const cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  TileDataEnc *this_tile = &cpi->tile_data[tile_row * tile_cols + tile_col];
  const TileInfo *const tile_info = &this_tile->tile_info;

  const int tile_mb_cols =
      (tile_info->mi_col_end - tile_info->mi_col_start + 2) >> 2;
  const int tile_mb_row = (mi_row - tile_info->mi_row_start + 2) >> 2;

  *tok = cpi->token_info.tile_tok[tile_row][tile_col] +
         get_token_alloc(tile_mb_row, tile_mb_cols, sb_size_log2, num_planes);
}